

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qppmhandler.cpp
# Opt level: O3

bool __thiscall QPpmHandler::canRead(QPpmHandler *this)

{
  bool bVar1;
  QIODevice *device;
  
  if (this->state == Error) {
    return false;
  }
  if (this->state == Ready) {
    device = QImageIOHandler::device(&this->super_QImageIOHandler);
    bVar1 = canRead(device,&this->subType);
    if (!bVar1) {
      return false;
    }
    if (this->state == Error) {
      return false;
    }
  }
  QImageIOHandler::setFormat(&this->super_QImageIOHandler,&this->subType);
  return true;
}

Assistant:

bool QPpmHandler::canRead() const
{
    if (state == Ready && !canRead(device(), &subType))
        return false;

    if (state != Error) {
        setFormat(subType);
        return true;
    }

    return false;
}